

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.cpp
# Opt level: O2

void fp::API::clearText(int x,int y)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"clearText ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,x);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,y);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void fp::API::clearText(int x, int y) {
    std::cout << "clearText " << x << " " << y << std::endl;
}